

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qurl.cpp
# Opt level: O1

weak_ordering compareThreeWay(QUrl *lhs,QUrl *rhs)

{
  int iVar1;
  QUrlPrivate *pQVar2;
  char cVar3;
  byte bVar4;
  int iVar5;
  char cVar6;
  bool bVar7;
  
  pQVar2 = lhs->d;
  bVar7 = true;
  if (pQVar2 == (QUrlPrivate *)0x0) {
LAB_0025f995:
    pQVar2 = rhs->d;
    if (pQVar2 == (QUrlPrivate *)0x0) {
      cVar6 = '\0';
    }
    else {
      cVar6 = -1;
      if ((pQVar2->sectionIsPresent == '\0') && (pQVar2->port == -1)) {
        cVar6 = -((pQVar2->path).d.size != 0);
      }
    }
    cVar3 = '\x01';
    if (bVar7) {
      cVar3 = cVar6;
    }
    return (weak_ordering)cVar3;
  }
  if (rhs->d == (QUrlPrivate *)0x0) {
    if (pQVar2 != (QUrlPrivate *)0x0) {
      bVar7 = false;
      if ((pQVar2->sectionIsPresent == '\0') && (bVar7 = false, pQVar2->port == -1)) {
        bVar7 = (pQVar2->path).d.size == 0;
      }
    }
    goto LAB_0025f995;
  }
  iVar5 = QString::compare(&pQVar2->scheme,&rhs->d->scheme,CaseSensitive);
  if ((((iVar5 == 0) &&
       (iVar5 = QString::compare(&lhs->d->userName,&rhs->d->userName,CaseSensitive), iVar5 == 0)) &&
      (iVar5 = QString::compare(&lhs->d->password,&rhs->d->password,CaseSensitive), iVar5 == 0)) &&
     (iVar5 = QString::compare(&lhs->d->host,&rhs->d->host,CaseSensitive), iVar5 == 0)) {
    iVar5 = rhs->d->port;
    iVar1 = lhs->d->port;
    if (iVar1 != iVar5) {
      bVar4 = -(iVar1 < iVar5);
      goto LAB_0025f973;
    }
    iVar5 = QString::compare(&lhs->d->path,&rhs->d->path,CaseSensitive);
    if (iVar5 == 0) {
      bVar4 = rhs->d->sectionIsPresent;
      if ((lhs->d->sectionIsPresent & 0x40) >> 6 != (bVar4 & 0x40) >> 6) {
        bVar4 = -((bVar4 >> 6 & 1) != 0);
        goto LAB_0025f973;
      }
      iVar5 = QString::compare(&lhs->d->query,&rhs->d->query,CaseSensitive);
      if (iVar5 == 0) {
        bVar4 = rhs->d->sectionIsPresent;
        if (-1 < (char)(lhs->d->sectionIsPresent ^ bVar4)) {
          iVar5 = QString::compare(&lhs->d->fragment,&rhs->d->fragment,CaseSensitive);
          if (iVar5 != 0) {
            return (weak_ordering)((byte)(iVar5 >> 0x1f) | 1);
          }
          return (weak_ordering)'\0';
        }
        bVar4 = (char)bVar4 >> 7;
        goto LAB_0025f973;
      }
    }
  }
  bVar4 = (byte)(iVar5 >> 0x1f);
LAB_0025f973:
  return (weak_ordering)(bVar4 | 1);
}

Assistant:

Qt::weak_ordering compareThreeWay(const QUrl &lhs, const QUrl &rhs)
{
    if (!lhs.d || !rhs.d) {
        bool thisIsEmpty = !lhs.d || lhs.d->isEmpty();
        bool thatIsEmpty = !rhs.d || rhs.d->isEmpty();

        // sort an empty URL first
        if (thisIsEmpty) {
            if (!thatIsEmpty)
                return Qt::weak_ordering::less;
            else
                return Qt::weak_ordering::equivalent;
        } else {
            return Qt::weak_ordering::greater;
        }
    }

    int cmp;
    cmp = lhs.d->scheme.compare(rhs.d->scheme);
    if (cmp != 0)
        return Qt::compareThreeWay(cmp, 0);

    cmp = lhs.d->userName.compare(rhs.d->userName);
    if (cmp != 0)
        return Qt::compareThreeWay(cmp, 0);

    cmp = lhs.d->password.compare(rhs.d->password);
    if (cmp != 0)
        return Qt::compareThreeWay(cmp, 0);

    cmp = lhs.d->host.compare(rhs.d->host);
    if (cmp != 0)
        return Qt::compareThreeWay(cmp, 0);

    if (lhs.d->port != rhs.d->port)
        return Qt::compareThreeWay(lhs.d->port, rhs.d->port);

    cmp = lhs.d->path.compare(rhs.d->path);
    if (cmp != 0)
        return Qt::compareThreeWay(cmp, 0);

    if (lhs.d->hasQuery() != rhs.d->hasQuery())
        return rhs.d->hasQuery() ? Qt::weak_ordering::less : Qt::weak_ordering::greater;

    cmp = lhs.d->query.compare(rhs.d->query);
    if (cmp != 0)
        return Qt::compareThreeWay(cmp, 0);

    if (lhs.d->hasFragment() != rhs.d->hasFragment())
        return rhs.d->hasFragment() ? Qt::weak_ordering::less : Qt::weak_ordering::greater;

    cmp = lhs.d->fragment.compare(rhs.d->fragment);
    return Qt::compareThreeWay(cmp, 0);
}